

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_writer_flush_message(mpack_writer_t *writer)

{
  char *pcVar1;
  size_t used;
  size_t sVar2;
  
  if (writer->error == mpack_ok) {
    if (writer->flush == (mpack_writer_flush_t)0x0) {
      writer->error = mpack_error_bug;
      if (writer->error_fn != (mpack_writer_error_t)0x0) {
        (*writer->error_fn)(writer,mpack_error_bug);
        return;
      }
    }
    else {
      pcVar1 = writer->buffer;
      sVar2 = (long)writer->current - (long)pcVar1;
      if (sVar2 != 0) {
        writer->current = pcVar1;
        (*writer->flush)(writer,pcVar1,sVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

void mpack_writer_flush_message(mpack_writer_t* writer) {
    if (writer->error != mpack_ok)
        return;

    #if MPACK_WRITE_TRACKING
    mpack_writer_flag_if_error(writer, mpack_track_check_empty(&writer->track));
    if (writer->error != mpack_ok)
        return;
    #endif

    if (writer->flush == NULL) {
        mpack_break("cannot call mpack_writer_flush_message() without a flush function!");
        mpack_writer_flag_error(writer, mpack_error_bug);
        return;
    }

    if (mpack_writer_buffer_used(writer) > 0)
        mpack_writer_flush_unchecked(writer);
}